

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

int symstrcomp(object *left,char *right)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  uint local_34;
  int local_30;
  uint local_2c;
  int i;
  int minsize;
  int rightsize;
  int leftsize;
  char *right_local;
  object *left_local;
  
  uVar1 = (uint)(left->header >> 2) & 0x3fffffff;
  sVar3 = strlen(right);
  uVar2 = (uint)sVar3;
  local_34 = uVar2;
  if ((int)uVar1 < (int)uVar2) {
    local_34 = uVar1;
  }
  local_2c = local_34;
  if ((int)uVar2 < (int)local_34) {
    local_2c = uVar2;
  }
  local_30 = 0;
  while( true ) {
    if ((int)local_2c <= local_30) {
      return uVar1 - uVar2;
    }
    if (*(char *)((long)&left[1].header + (long)local_30) != right[local_30]) break;
    local_30 = local_30 + 1;
  }
  return (uint)*(byte *)((long)&left[1].header + (long)local_30) - (uint)(byte)right[local_30];
}

Assistant:

int symstrcomp(struct object *left, const char *right)
{
    int leftsize = SIZE(left);
    int rightsize = (int)strlen(right);
    int minsize = leftsize < rightsize ? leftsize : rightsize;
    register int i;

    if (rightsize < minsize) {
        minsize = rightsize;
    }
    for (i = 0; i < minsize; i++) {
        if ((bytePtr(left)[i]) != (unsigned char)(right[i])) {
            return bytePtr(left)[i]-(unsigned char)(right[i]);
        }
    }
    return leftsize - rightsize;
}